

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeViewPrivate::viewIndex(QTreeViewPrivate *this,QModelIndex *_index)

{
  ulong uVar1;
  QTreeViewItem *pQVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  QAbstractItemModel *pQVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  quintptr *pqVar14;
  int iVar15;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QAbstractItemModel *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = -1;
  if ((((-1 < _index->r) && (-1 < _index->c)) && ((_index->m).ptr != (QAbstractItemModel *)0x0)) &&
     (uVar1 = (this->viewItems).d.size, uVar1 != 0)) {
    local_38 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = (_index->m).ptr;
    if (pQVar7 == (QAbstractItemModel *)0x0) {
      pQVar7 = (QAbstractItemModel *)&puStack_40;
      local_48 = (undefined1 *)0xffffffffffffffff;
      puStack_40 = (undefined1 *)0x0;
      local_38 = (QAbstractItemModel *)0x0;
    }
    else if (_index->c == 0) {
      pQVar7 = (_index->m).ptr;
      local_48 = *(undefined1 **)_index;
      puStack_40 = (undefined1 *)_index->i;
      local_38 = pQVar7;
    }
    else {
      pQVar7 = (QAbstractItemModel *)
               (**(code **)(*(long *)pQVar7 + 0x70))(&local_48,pQVar7,_index->r,0);
    }
    iVar6 = this->lastViewedItem;
    iVar15 = (int)uVar1;
    iVar12 = iVar15 - iVar6;
    iVar4 = iVar6 + -1;
    if (iVar12 <= iVar6 + -1) {
      iVar4 = iVar12;
    }
    bVar3 = 0 < iVar4;
    if (0 < iVar4) {
      pQVar7 = (QAbstractItemModel *)(ulong)(uint)this->lastViewedItem;
      lVar10 = (long)iVar6 + -1;
      if ((long)iVar12 <= (long)iVar6 + -1) {
        lVar10 = (long)iVar12;
      }
      pQVar2 = (this->viewItems).d.ptr;
      lVar13 = 0;
      iVar6 = -1;
      uVar8 = 0;
      do {
        iVar12 = (int)pQVar7;
        if ((pQVar2[iVar12 + lVar13].index.r == (int)local_48) &&
           ((undefined1 *)pQVar2[iVar12 + lVar13].index.i == puStack_40)) {
          pQVar7 = (QAbstractItemModel *)(((ulong)pQVar7 & 0xffffffff) + lVar13);
LAB_005a8d28:
          this->lastViewedItem = (int)pQVar7;
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if ((pQVar2[iVar6 + iVar12].index.r == (int)local_48) &&
             ((undefined1 *)pQVar2[iVar6 + iVar12].index.i == puStack_40)) {
            pQVar7 = (QAbstractItemModel *)(ulong)(iVar12 + ~uVar8);
            goto LAB_005a8d28;
          }
        }
        if (!bVar5) break;
        uVar8 = uVar8 + 1;
        lVar13 = lVar13 + 1;
        bVar3 = (int)lVar13 < iVar4;
        iVar6 = iVar6 + -1;
      } while ((int)lVar10 != (int)lVar13);
    }
    iVar6 = (int)pQVar7;
    if (!bVar3) {
      uVar9 = this->lastViewedItem + iVar4;
      uVar8 = 0;
      if (0 < (int)uVar9) {
        uVar8 = uVar9;
      }
      bVar3 = (int)uVar8 < iVar15;
      if ((int)uVar8 < iVar15) {
        uVar11 = (ulong)uVar8;
        pqVar14 = &(this->viewItems).d.ptr[uVar11].index.i;
        do {
          bVar5 = true;
          if ((((QModelIndex *)(pqVar14 + -1))->r == (int)local_48) &&
             ((undefined1 *)*pqVar14 == puStack_40)) {
            this->lastViewedItem = (int)uVar11;
            bVar5 = false;
            pQVar7 = (QAbstractItemModel *)(uVar11 & 0xffffffff);
          }
          if (!bVar5) break;
          uVar11 = uVar11 + 1;
          bVar3 = (long)uVar11 < (long)iVar15;
          pqVar14 = pqVar14 + 5;
        } while ((uVar1 & 0xffffffff) != uVar11);
      }
      iVar6 = (int)pQVar7;
      if (!bVar3) {
        uVar8 = this->lastViewedItem - iVar4;
        uVar11 = (ulong)uVar8;
        if (iVar15 <= (int)uVar8) {
          uVar11 = uVar1 & 0xffffffff;
        }
        pQVar2 = (this->viewItems).d.ptr;
        do {
          if ((int)uVar11 < 1) {
            iVar6 = -1;
            break;
          }
          uVar11 = uVar11 - 1;
          bVar3 = true;
          if ((pQVar2[uVar11 & 0xffffffff].index.r == (int)local_48) &&
             ((undefined1 *)pQVar2[uVar11 & 0xffffffff].index.i == puStack_40)) {
            this->lastViewedItem = (int)uVar11;
            bVar3 = false;
            pQVar7 = (QAbstractItemModel *)(uVar11 & 0xffffffff);
          }
          iVar6 = (int)pQVar7;
        } while (bVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QTreeViewPrivate::viewIndex(const QModelIndex &_index) const
{
    if (!_index.isValid() || viewItems.isEmpty())
        return -1;

    const int totalCount = viewItems.size();
    const QModelIndex index = _index.sibling(_index.row(), 0);
    const int row = index.row();
    const quintptr internalId = index.internalId();

    // We start nearest to the lastViewedItem
    int localCount = qMin(lastViewedItem - 1, totalCount - lastViewedItem);
    for (int i = 0; i < localCount; ++i) {
        const QModelIndex &idx1 = viewItems.at(lastViewedItem + i).index;
        if (idx1.row() == row && idx1.internalId() == internalId) {
            lastViewedItem = lastViewedItem + i;
            return lastViewedItem;
        }
        const QModelIndex &idx2 = viewItems.at(lastViewedItem - i - 1).index;
        if (idx2.row() == row && idx2.internalId() == internalId) {
            lastViewedItem = lastViewedItem - i - 1;
            return lastViewedItem;
        }
    }

    for (int j = qMax(0, lastViewedItem + localCount); j < totalCount; ++j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }
    for (int j = qMin(totalCount, lastViewedItem - localCount) - 1; j >= 0; --j) {
        const QModelIndex &idx = viewItems.at(j).index;
        if (idx.row() == row && idx.internalId() == internalId) {
            lastViewedItem = j;
            return j;
        }
    }

    // nothing found
    return -1;
}